

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core-C-API.cpp
# Opt level: O1

unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> __thiscall
anon_unknown.dwarf_2b281f::CAPIBuildEngineDelegate::lookupRule
          (CAPIBuildEngineDelegate *this,KeyType *key)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  long *in_RDX;
  llb_data_t key_data;
  long local_38;
  long local_30;
  
  pp_Var2 = (_func_int **)operator_new(0x68);
  *pp_Var2 = (_func_int *)&PTR___cxa_pure_virtual_00243c90;
  pp_Var2[1] = (_func_int *)(pp_Var2 + 3);
  std::__cxx11::string::_M_construct<char*>((string *)(pp_Var2 + 1),*in_RDX,in_RDX[1] + *in_RDX);
  pp_Var2[5] = (_func_int *)0x0;
  *pp_Var2 = (_func_int *)&PTR__Rule_002423d0;
  pp_Var2[0xc] = (_func_int *)0x0;
  p_Var1 = (_func_int *)(key->key).field_2._M_allocated_capacity;
  pp_Var2[0xc] = p_Var1;
  local_38 = in_RDX[1];
  local_30 = *in_RDX;
  (*(code *)key[1].key._M_dataplus._M_p)(p_Var1,&local_38,pp_Var2 + 6);
  if (pp_Var2[9] != (_func_int *)0x0) {
    (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = pp_Var2;
    return (__uniq_ptr_data<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>,_true,_true>
            )(__uniq_ptr_data<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>,_true,_true>
              )this;
  }
  __assert_fail("capiRule->rule.create_task && \"client failed to initialize rule\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/Core-C-API.cpp"
                ,0x4d,
                "virtual std::unique_ptr<Rule> (anonymous namespace)::CAPIBuildEngineDelegate::lookupRule(const KeyType &)"
               );
}

Assistant:

virtual std::unique_ptr<Rule> lookupRule(const KeyType& key) override {
    CAPIRule* capiRule = new CAPIRule(key);
    capiRule->engineContext = cAPIDelegate.context;
    llb_data_t key_data{ key.size(), (const uint8_t*)key.data() };
    cAPIDelegate.lookup_rule(cAPIDelegate.context, &key_data, &capiRule->rule);

    // FIXME: Check that the client created the rule appropriately. We should
    // change the API to be type safe here, by forcing the client to return a
    // handle created by the C API.
    assert(capiRule->rule.create_task && "client failed to initialize rule");

    return std::unique_ptr<Rule>(capiRule);
  }